

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

void __thiscall pbrt::SquareMatrix<2>::SquareMatrix(SquareMatrix<2> *this,span<const_float> t)

{
  size_t sVar1;
  float *pfVar2;
  char (*in_RDX) [6];
  char *unaff_RBX;
  char (*in_RSI) [9];
  long in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  char (*in_stack_00000020) [6];
  int *in_stack_00000028;
  char (*in_stack_00000030) [9];
  int i;
  size_t vb;
  int va;
  int local_34;
  
  sVar1 = pstd::span<const_float>::size((span<const_float> *)&stack0xffffffffffffffe8);
  if (sVar1 != 4) {
    LogFatal<char_const(&)[6],char_const(&)[9],char_const(&)[6],int&,char_const(&)[9],unsigned_long&>
              (in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDX,in_RSI,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,(unsigned_long *)vb);
  }
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    pfVar2 = pstd::span<const_float>::operator[]
                       ((span<const_float> *)&stack0xffffffffffffffe8,(long)local_34);
    *(float *)(in_RDI + (long)(local_34 / 2) * 8 + (long)(local_34 % 2) * 4) = *pfVar2;
  }
  return;
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N>::SquareMatrix(pstd::span<const Float> t) {
    CHECK_EQ(N * N, t.size());
    for (int i = 0; i < N * N; ++i)
        m[i / N][i % N] = t[i];
}